

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

void signop_coroutine(PageantAsyncOp *pao)

{
  PageantClientRequestId **so;
  PageantClientRequestNode **ppPVar1;
  int iVar2;
  PageantKey *pk;
  PageantClientRequestId *pPVar3;
  PageantClientRequestNode *pPVar4;
  ssh_keyalg *psVar5;
  PageantClient *pPVar6;
  PageantClientRequestNode *pPVar7;
  ptrlen pVar8;
  PageantKeyRequestNode *pPVar9;
  _Bool _Var10;
  uint uVar11;
  ssh2_userkey *psVar12;
  void *ptr;
  strbuf *buf;
  strbuf *sb;
  
  so = &pao[-2].reqid;
  iVar2 = *(int *)((long)&pao[-1].info + 4);
  if (iVar2 == 0x1c0) {
    signop_unlink((PageantSignOp *)so);
    psVar12 = *(ssh2_userkey **)(*so + 10);
  }
  else {
    if (iVar2 == 0x1b0) {
      signop_unlink((PageantSignOp *)so);
    }
    else if (iVar2 != 0) {
      return;
    }
    pPVar9 = requests_blocked_on_gui.prev;
    pk = (PageantKey *)*so;
    psVar12 = (pk->field_3).skey;
    if ((psVar12 == (ssh2_userkey *)0x0) && ((gui_request_in_progress & 1) != 0)) {
      if (pao[-1].cr.next != (PageantClientRequestNode *)0x0) {
        __assert_fail("!so->pkr.prev",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                      0x179,"void signop_link_to_pending_gui_request(PageantSignOp *)");
      }
      if (pao[-1].reqid == (PageantClientRequestId *)0x0) {
        ppPVar1 = &pao[-1].cr.next;
        pao[-1].cr.next = (PageantClientRequestNode *)requests_blocked_on_gui.prev;
        pao[-1].reqid = (PageantClientRequestId *)&requests_blocked_on_gui;
        pPVar9->next = (PageantKeyRequestNode *)ppPVar1;
        *(PageantClientRequestNode ***)pao[-1].reqid = ppPVar1;
        *(undefined4 *)((long)&pao[-1].info + 4) = 0x1b0;
        return;
      }
      __assert_fail("!so->pkr.next",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                    0x17a,"void signop_link_to_pending_gui_request(PageantSignOp *)");
    }
    if (psVar12 == (ssh2_userkey *)0x0) {
      if (pk->encrypted_key_file == (strbuf *)0x0) {
        __assert_fail("so->pk->encrypted_key_file",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                      0x1b5,"void signop_coroutine(PageantAsyncOp *)");
      }
      _Var10 = request_passphrase(pao->info->pc,pk);
      if (_Var10) {
        if (pao[-1].cr.next != (PageantClientRequestNode *)0x0) {
          __assert_fail("!so->pkr.prev",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c"
                        ,0x16e,"void signop_link_to_key(PageantSignOp *)");
        }
        if (pao[-1].reqid == (PageantClientRequestId *)0x0) {
          ppPVar1 = &pao[-1].cr.next;
          pPVar3 = pao[-2].reqid;
          pPVar4 = *(PageantClientRequestNode **)(pPVar3 + 0x10);
          pao[-1].cr.next = pPVar4;
          pao[-1].reqid = pPVar3 + 0x10;
          pPVar4->next = (PageantClientRequestNode *)ppPVar1;
          *(PageantClientRequestNode ***)pao[-1].reqid = ppPVar1;
          *(undefined4 *)((long)&pao[-1].info + 4) = 0x1c0;
          return;
        }
        __assert_fail("!so->pkr.next",
                      "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/pageant.c",
                      0x16f,"void signop_link_to_key(PageantSignOp *)");
      }
      sb = strbuf_new();
      failure(pao->info->pc,pao->reqid,sb,*(uchar *)&pao[-1].cr.prev,
              "on-demand decryption could not prompt for a passphrase");
      goto LAB_00115bf4;
    }
  }
  psVar5 = psVar12->key->vt;
  uVar11 = (*psVar5->supported_flags)(psVar5);
  if ((*(uint *)&pao[-1].info & ~uVar11) == 0) {
    ptr = (void *)(**(code **)(*(long *)**(undefined8 **)(*so + 10) + 0x20))();
    buf = strbuf_new();
    if (ptr == (void *)0x0) {
      (**(code **)(*(long *)**(undefined8 **)(pao[-2].reqid + 10) + 0x28))
                ((long *)**(undefined8 **)(pao[-2].reqid + 10),(pao[-1].vt)->free,
                 pao[-1].vt[1].coroutine,*(undefined4 *)&pao[-1].info,buf->binarysink_);
      sb = strbuf_new();
      BinarySink_put_byte(sb->binarysink_,'\x0e');
      BinarySink_put_stringsb(sb->binarysink_,buf);
    }
    else {
      failure(pao->info->pc,pao->reqid,buf,*(uchar *)&pao[-1].cr.prev,"key invalid: %s",ptr);
      safefree(ptr);
      sb = buf;
    }
  }
  else {
    sb = strbuf_new();
    failure(pao->info->pc,pao->reqid,sb,*(uchar *)&pao[-1].cr.prev,"unsupported flag bits 0x%08x",
            (ulong)(~uVar11 & *(uint *)&pao[-1].info));
  }
LAB_00115bf4:
  pPVar6 = pao->info->pc;
  pVar8.ptr = sb->u;
  pVar8.len = sb->len;
  (*pPVar6->vt->got_response)(pPVar6,pao->reqid,pVar8);
  strbuf_free(sb);
  pPVar4 = (pao->cr).prev;
  pPVar7 = (pao->cr).next;
  pPVar4->next = pPVar7;
  pPVar7->prev = pPVar4;
  delete_callbacks_for_context(pao);
  (*pao->vt->free)(pao);
  return;
}

Assistant:

static void signop_coroutine(PageantAsyncOp *pao)
{
    PageantSignOp *so = container_of(pao, PageantSignOp, pao);
    strbuf *response;

    crBegin(so->crLine);

    while (!so->pk->skey && gui_request_in_progress) {
        signop_link_to_pending_gui_request(so);
        crReturnV;
        signop_unlink(so);
    }

    if (!so->pk->skey) {
        assert(so->pk->encrypted_key_file);

        if (!request_passphrase(so->pao.info->pc, so->pk)) {
            response = strbuf_new();
            failure(so->pao.info->pc, so->pao.reqid, response,
                    so->failure_type, "on-demand decryption could not "
                    "prompt for a passphrase");
            goto respond;
        }

        signop_link_to_key(so);
        crReturnV;
        signop_unlink(so);
    }

    uint32_t supported_flags = ssh_key_supported_flags(so->pk->skey->key);
    if (so->flags & ~supported_flags) {
        /*
         * We MUST reject any message containing flags we don't
         * understand.
         */
        response = strbuf_new();
        failure(so->pao.info->pc, so->pao.reqid, response, so->failure_type,
                "unsupported flag bits 0x%08"PRIx32,
                so->flags & ~supported_flags);
        goto respond;
    }

    char *invalid = ssh_key_invalid(so->pk->skey->key, so->flags);
    if (invalid) {
        response = strbuf_new();
        failure(so->pao.info->pc, so->pao.reqid, response, so->failure_type,
                "key invalid: %s", invalid);
        sfree(invalid);
        goto respond;
    }

    strbuf *signature = strbuf_new();
    ssh_key_sign(so->pk->skey->key, ptrlen_from_strbuf(so->data_to_sign),
                 so->flags, BinarySink_UPCAST(signature));

    response = strbuf_new();
    put_byte(response, SSH2_AGENT_SIGN_RESPONSE);
    put_stringsb(response, signature);

  respond:
    pageant_client_got_response(so->pao.info->pc, so->pao.reqid,
                                ptrlen_from_strbuf(response));
    strbuf_free(response);

    pageant_async_op_unlink_and_free(&so->pao);
    crFinishFreedV;
}